

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void dynamic_api_suite::api_key_comp(void)

{
  pair<int,_int> *local_48;
  undefined1 local_40 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> span;
  pair<int,_int> array [4];
  
  local_48 = (pair<int,_int> *)&span.member;
  do {
    memset(local_48,0,8);
    vista::pair<int,_int>::pair(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != array + 3);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::map_view<4UL,_0>
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
             (value_type (*) [4])&span.member);
  boost::detail::test_impl
            ("!span.key_comp()(11, 10)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x93,"void dynamic_api_suite::api_key_comp()",true);
  boost::detail::test_impl
            ("!span.key_comp()(11, 11)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x94,"void dynamic_api_suite::api_key_comp()",true);
  boost::detail::test_impl
            ("span.key_comp()(11, 12)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x95,"void dynamic_api_suite::api_key_comp()",true);
  return;
}

Assistant:

void api_key_comp()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    BOOST_TEST(!span.key_comp()(11, 10));
    BOOST_TEST(!span.key_comp()(11, 11));
    BOOST_TEST(span.key_comp()(11, 12));
}